

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

int64_t mpack_expect_i64(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  mpack_tag_t mVar2;
  
  mVar2 = mpack_read_tag(reader);
  aVar1 = mVar2.v;
  if ((mVar2.type != mpack_type_int) && ((mVar2.type != mpack_type_uint || (aVar1.i < 0)))) {
    if (reader->error == mpack_ok) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
      }
    }
    aVar1.u = 0;
  }
  return aVar1.u;
}

Assistant:

int64_t mpack_expect_i64(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint) {
        if (var.v.u <= INT64_MAX)
            return (int64_t)var.v.u;
    } else if (var.type == mpack_type_int) {
        return var.v.i;
    }
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
}